

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

void __thiscall
TwoStageDynamicBayesianNetwork::TwoStageDynamicBayesianNetwork
          (TwoStageDynamicBayesianNetwork *this,
          MultiAgentDecisionProcessDiscreteFactoredStatesInterface *madp)

{
  undefined1 auVar1 [64];
  
  this->_m_madp = madp;
  this->_m_SoIStorageInitialized = false;
  this->_m_nrY = 0;
  this->_m_nrO = 0;
  auVar1 = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])
   &(this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar1;
  this->_m_XSoI_Y = (vector<Scope,_std::allocator<Scope>_>)auVar1._0_24_;
  this->_m_ASoI_Y = (vector<Scope,_std::allocator<Scope>_>)auVar1._24_24_;
  (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->_m_YSoI_Y).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->_m_ASoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar1;
  memset(&this->_m_nrVals_XSoI_Y,0,0x2e0);
  return;
}

Assistant:

TwoStageDynamicBayesianNetwork::TwoStageDynamicBayesianNetwork(
                MultiAgentDecisionProcessDiscreteFactoredStatesInterface& madp)
            :
                _m_madp(&madp)
                ,_m_nrY(0)
                ,_m_nrO(0)
{
    _m_SoIStorageInitialized = false;
    _m_IndividualToJointYiiIndices_catVector = 0;
    _m_IndividualToJointOiiIndices_catVector = 0;
    _m_SampleY = 0;
    _m_SampleO = 0;
    _m_SampleNrO = 0;

}